

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O2

void triangle(Model *model,array<vec<4UL,_double>,_3UL> pts,IShader *shader,TGAImage *image,
             DepthBuffer *zbuffer)

{
  undefined1 auVar1 [16];
  double dVar2;
  int iVar3;
  double *pdVar4;
  double *pdVar5;
  vec<4UL,_double> *pvVar6;
  int j;
  size_t sVar7;
  long lVar8;
  size_t y;
  double dVar9;
  vec<2UL,_double> vVar10;
  vec2f A;
  vec2f B;
  vec2f C;
  vec2f P;
  TGAColor color;
  undefined1 local_148 [16];
  double local_138;
  undefined1 local_128 [24];
  TGAImage *local_110;
  Model *local_108;
  IShader *local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  array<vec<2UL,_double>,_3UL> pts2;
  vec<2UL,_double> local_88;
  vec<2UL,_double> local_78;
  vec3f bc_screen;
  vec<3UL,_double> local_48;
  
  pts2._M_elems[2].x = 0.0;
  pts2._M_elems[2].y = 0.0;
  pts2._M_elems[1].x = 0.0;
  pts2._M_elems[1].y = 0.0;
  pts2._M_elems[0].x = 0.0;
  pts2._M_elems[0].y = 0.0;
  pvVar6 = pts._M_elems;
  local_110 = image;
  local_108 = model;
  local_100 = shader;
  for (lVar8 = 8; lVar8 != 0x38; lVar8 = lVar8 + 0x10) {
    vVar10 = proj<2ul,4ul,double>(pvVar6);
    *(double *)((long)pts2._M_elems + lVar8 + -8) = vVar10.x;
    *(double *)((long)&pts2._M_elems[0].x + lVar8) = vVar10.y;
    pvVar6 = pvVar6 + 1;
  }
  local_78.x = 1.79769313486232e+308;
  local_78.y = 1.79769313486232e+308;
  local_88.x = -1.79769313486232e+308;
  local_88.y = -1.79769313486232e+308;
  lVar8 = 0;
  while (lVar8 != 3) {
    local_128._0_8_ = lVar8;
    pvVar6 = pts._M_elems + lVar8;
    for (sVar7 = 0; sVar7 != 2; sVar7 = sVar7 + 1) {
      pdVar4 = vec<2UL,_double>::operator[](&local_78,sVar7);
      pdVar5 = vec<4UL,_double>::operator[](pvVar6,sVar7);
      dVar2 = *pdVar5 / pts._M_elems[lVar8].data[3];
      if (*pdVar4 <= dVar2) {
        dVar2 = *pdVar4;
      }
      pdVar4 = vec<2UL,_double>::operator[](&local_78,sVar7);
      *pdVar4 = dVar2;
      pdVar4 = vec<2UL,_double>::operator[](&local_88,sVar7);
      pdVar5 = vec<4UL,_double>::operator[](pvVar6,sVar7);
      dVar2 = *pdVar5 / pts._M_elems[lVar8].data[3];
      if (dVar2 <= *pdVar4) {
        dVar2 = *pdVar4;
      }
      pdVar4 = vec<2UL,_double>::operator[](&local_88,sVar7);
      *pdVar4 = dVar2;
    }
    lVar8 = local_128._0_8_ + 1;
  }
  color.bgra[0] = '\0';
  color.bgra[1] = '\0';
  color.bgra[2] = '\0';
  color.bgra[3] = '\0';
  color.bytespp = '\0';
  local_d0 = pts2._M_elems[0].x;
  local_d8 = pts2._M_elems[0].y;
  local_e0 = pts2._M_elems[1].x;
  local_e8 = pts2._M_elems[1].y;
  local_f0 = pts2._M_elems[2].x;
  local_f8 = pts2._M_elems[2].y;
  sVar7 = (size_t)(int)local_78.x;
  lVar8 = sVar7 * 8;
  for (; (long)sVar7 <= (long)(int)local_88.x; sVar7 = sVar7 + 1) {
    local_c8 = (double)(int)sVar7;
    for (y = (size_t)(int)local_78.y; (long)y <= (long)(int)local_88.y; y = y + 1) {
      P.y = (double)(int)y;
      A.y = local_d8;
      A.x = local_d0;
      B.y = local_e8;
      B.x = local_e0;
      C.y = local_f8;
      C.x = local_f0;
      P.x = local_c8;
      barycentric(&bc_screen,A,B,C,P);
      dVar2 = bc_screen.z;
      local_138 = bc_screen.z / pts._M_elems[2].data[3];
      local_128._0_8_ = bc_screen.x;
      local_128._8_8_ = bc_screen.y;
      auVar1._8_4_ = SUB84(pts._M_elems[1].data[3],0);
      auVar1._0_8_ = pts._M_elems[0].data[3];
      auVar1._12_4_ = (int)((ulong)pts._M_elems[1].data[3] >> 0x20);
      local_148 = divpd((undefined1  [16])bc_screen._0_16_,auVar1);
      local_c0 = local_148._8_8_ + local_148._0_8_ + local_138;
      operator/(&local_48,(vec<3UL,_double> *)local_148,&local_c0);
      local_138 = local_48.z;
      dVar9 = (dVar2 * pts._M_elems[2].data[2] +
              (double)local_128._0_8_ * pts._M_elems[0].data[2] +
              pts._M_elems[1].data[2] * (double)local_128._8_8_) /
              (dVar2 * pts._M_elems[2].data[3] +
              (double)local_128._0_8_ * pts._M_elems[0].data[3] +
              pts._M_elems[1].data[3] * (double)local_128._8_8_) + 0.5;
      if (255.0 <= dVar9) {
        dVar9 = 255.0;
      }
      if (((0.0 <= (double)local_128._0_8_) && (0.0 <= (double)local_128._8_8_)) && (0.0 <= dVar2))
      {
        if (dVar9 <= 0.0) {
          dVar9 = 0.0;
        }
        if (*(double *)
             ((long)(zbuffer->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + y * 8 + zbuffer->width * lVar8) <= dVar9) {
          iVar3 = (*local_100->_vptr_IShader[3])(local_100,local_108,&color);
          if ((char)iVar3 == '\0') {
            *(double *)
             ((long)(zbuffer->data).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + y * 8 + zbuffer->width * lVar8) = dVar9;
            TGAImage::set(local_110,sVar7,y,&color);
          }
        }
      }
    }
    lVar8 = lVar8 + 8;
  }
  return;
}

Assistant:

void triangle(Model &model, std::array<vec4f, 3> pts, IShader &shader, TGAImage &image,
              DepthBuffer &zbuffer)
{
    std::array<vec2f, 3> pts2;
    for (int i = 0; i < 3; i++) pts2[i] = proj<2>(pts[i]);

    vec2f bboxmin(std::numeric_limits<double>::max(), std::numeric_limits<double>::max());
    vec2f bboxmax(-std::numeric_limits<double>::max(), -std::numeric_limits<double>::max());
    for (int i = 0; i < 3; i++) {
        for (int j = 0; j < 2; j++) {
            bboxmin[j] = std::min(bboxmin[j], pts[i][j] / pts[i][3]);
            bboxmax[j] = std::max(bboxmax[j], pts[i][j] / pts[i][3]);
        }
    }
    vec2i P;
    TGAColor color;
    for (P.x = static_cast<int>(bboxmin.x); P.x <= static_cast<int>(bboxmax.x); P.x++) {
        for (P.y = static_cast<int>(bboxmin.y); P.y <= static_cast<int>(bboxmax.y); P.y++) {
            vec3f bc_screen = barycentric(pts2[0], pts2[1], pts2[2], to_f(P));
            vec3f bc_clip =
                vec3f(bc_screen.x / pts[0][3], bc_screen.y / pts[1][3], bc_screen.z / pts[2][3]);
            bc_clip = bc_clip / (bc_clip.x + bc_clip.y + bc_clip.z);
            double z = pts[0][2] * bc_screen.x + pts[1][2] * bc_screen.y + pts[2][2] * bc_screen.z;
            double w = pts[0][3] * bc_screen.x + pts[1][3] * bc_screen.y + pts[2][3] * bc_screen.z;
            double frag_depth = std::max(0., std::min(255., z / w + .5));
            if (bc_screen.x < 0 || bc_screen.y < 0 || bc_screen.z < 0 ||
                zbuffer.get(P.x, P.y) > frag_depth)
                continue;
            bool discard = shader.fragment(model, bc_clip, color);
            if (!discard) {
                zbuffer.set(P.x, P.y, frag_depth);
                image.set(P.x, P.y, color);
            }
        }
    }
}